

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::anon_unknown_5::createIndexData
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,TestConfig *config)

{
  unsigned_short *__args;
  int triangleNdx;
  uint uVar1;
  unsigned_short local_3c [6];
  
  for (uVar1 = 0; (int)uVar1 < config->triangleCount; uVar1 = uVar1 + 1) {
    if ((uVar1 & 1) == 0) {
      local_3c[5] = 0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (data,local_3c + 5);
      local_3c[4] = 1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (data,local_3c + 4);
      local_3c[3] = 2;
      __args = local_3c + 3;
    }
    else {
      local_3c[2] = 2;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (data,local_3c + 2);
      local_3c[1] = 3;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (data,local_3c + 1);
      local_3c[0] = 0;
      __args = local_3c;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (data,__args);
  }
  return;
}

Assistant:

void createIndexData (vector<deUint16>& data, const TestConfig& config)
{
	for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
	{
		if ((triangleNdx % 2) == 0)
		{
			data.push_back(0);
			data.push_back(1);
			data.push_back(2);
		}
		else
		{
			data.push_back(2);
			data.push_back(3);
			data.push_back(0);
		}
	}
}